

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O3

string * __thiscall
VideoHppGenerator::generateEnum
          (string *__return_storage_ptr__,VideoHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
          *enumData)

{
  size_type *psVar1;
  pointer pcVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer pEVar8;
  long lVar9;
  size_type __pos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer __y;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string strippedValue;
  string strippedValue_1;
  string enumTemplate;
  string enumValues;
  string prefix;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  valueToNameMap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  size_type *local_f8;
  size_type local_f0;
  size_type local_e8;
  undefined8 uStack_e0;
  string *local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::EnumData>
  *local_d0;
  pointer local_c8;
  pointer local_c0;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  size_type sVar10;
  
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = __return_storage_ptr__;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  toUpperCase(&local_1b8.first,&enumData->first);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1b8.first,"_");
  local_f8 = &local_e8;
  psVar1 = (size_type *)(pbVar4->_M_dataplus)._M_p;
  paVar11 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1 == paVar11) {
    local_e8 = paVar11->_M_allocated_capacity;
    uStack_e0 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_e8 = paVar11->_M_allocated_capacity;
    local_f8 = psVar1;
  }
  local_f0 = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  paVar11 = &local_1b8.first.field_2;
  local_240 = &local_1b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.first._M_dataplus._M_p != paVar11) {
    operator_delete(local_1b8.first._M_dataplus._M_p,
                    local_1b8.first.field_2._M_allocated_capacity + 1);
  }
  pEVar8 = (enumData->second).values.
           super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_c8 = (enumData->second).values.
             super__Vector_base<VideoHppGenerator::EnumValueData,_std::allocator<VideoHppGenerator::EnumValueData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = enumData;
  if (pEVar8 != local_c8) {
    paVar7 = &local_280.field_2;
    do {
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      pcVar2 = (pEVar8->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2a0,pcVar2,pcVar2 + (pEVar8->name)._M_string_length);
      sVar10 = local_f0;
      if ((local_f0 <= local_2a0._M_string_length) &&
         ((local_f0 == 0 || (iVar3 = bcmp(local_2a0._M_dataplus._M_p,local_f8,local_f0), iVar3 == 0)
          ))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&local_2a0,0,sVar10);
      }
      toCamelCase(&local_1b8.first,&local_2a0,true);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1b8.first,0,0,"e",1);
      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if (paVar6 == paVar5) {
        local_260.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_260.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_260.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_260._M_dataplus._M_p = (pointer)paVar6;
      }
      local_260._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.first._M_dataplus._M_p != paVar11) {
        operator_delete(local_1b8.first._M_dataplus._M_p,
                        local_1b8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_1b8,&local_260,&pEVar8->name);
      pVar12 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&local_90,&local_1b8);
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        __assert_fail("valueToNameMap.insert( { valueName, value.name } ).second",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0xbf,
                      "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                     );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.second._M_dataplus._M_p != &local_1b8.second.field_2) {
        operator_delete(local_1b8.second._M_dataplus._M_p,
                        local_1b8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.first._M_dataplus._M_p != paVar11) {
        operator_delete(local_1b8.first._M_dataplus._M_p,
                        local_1b8.first.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_238,"    ",&local_260);
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_238," = ");
      local_280._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p == paVar6) {
        local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_280.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_280._M_dataplus._M_p = (pointer)paVar7;
      }
      else {
        local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_280._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_280,(pEVar8->name)._M_dataplus._M_p,(pEVar8->name)._M_string_length)
      ;
      local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar4->_M_dataplus)._M_p;
      paVar5 = &pbVar4->field_2;
      if (paVar6 == paVar5) {
        local_2a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_2a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      }
      else {
        local_2a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_2a0._M_dataplus._M_p = (pointer)paVar6;
      }
      local_2a0._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2a0,",\n");
      local_1b8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
      paVar6 = &pbVar4->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.first._M_dataplus._M_p == paVar6) {
        local_1b8.first.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_1b8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        local_1b8.first._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_1b8.first.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_1b8.first._M_string_length = pbVar4->_M_string_length;
      (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar4->_M_string_length = 0;
      (pbVar4->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_1d8,local_1b8.first._M_dataplus._M_p,local_1b8.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8.first._M_dataplus._M_p != paVar11) {
        operator_delete(local_1b8.first._M_dataplus._M_p,
                        local_1b8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != paVar7) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      __y = (pEVar8->aliases).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_b8 = (pEVar8->aliases).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_c0 = pEVar8;
      if (__y != local_b8) {
        do {
          pcVar2 = (__y->first)._M_dataplus._M_p;
          local_280._M_dataplus._M_p = (pointer)paVar7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar2,pcVar2 + (__y->first)._M_string_length);
          sVar10 = local_f0;
          if ((local_f0 <= local_280._M_string_length) &&
             ((local_f0 == 0 ||
              (iVar3 = bcmp(local_280._M_dataplus._M_p,local_f8,local_f0), iVar3 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_280,0,sVar10);
          }
          toCamelCase(&local_1b8.first,&local_280,true);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_1b8.first,0,0,"e",1);
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_2a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_2a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_2a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_2a0._M_dataplus._M_p = (pointer)paVar6;
          }
          local_2a0._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.first._M_dataplus._M_p != paVar11) {
            operator_delete(local_1b8.first._M_dataplus._M_p,
                            local_1b8.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar7) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                    (&local_1b8,&local_2a0,&__y->first);
          pVar12 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                             ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                               *)&local_90,&local_1b8);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            __assert_fail("valueToNameMap.insert( { aliasName, alias.first } ).second",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                          ,0xc5,
                          "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                         );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.second._M_dataplus._M_p != &local_1b8.second.field_2) {
            operator_delete(local_1b8.second._M_dataplus._M_p,
                            local_1b8.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.first._M_dataplus._M_p != paVar11) {
            operator_delete(local_1b8.first._M_dataplus._M_p,
                            local_1b8.first.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_b0,"    ",&local_2a0);
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_b0," VULKAN_HPP_DEPRECATED_17( \"");
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_218.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_218._M_dataplus._M_p = (pointer)paVar6;
          }
          local_218._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_218,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_138._M_dataplus._M_p = (pointer)paVar6;
          }
          local_138._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_138," is deprecated, ");
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_118.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_118.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_118._M_dataplus._M_p = (pointer)paVar6;
          }
          local_118._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_118,local_260._M_dataplus._M_p,local_260._M_string_length);
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_1f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_1f8._M_dataplus._M_p = (pointer)paVar6;
          }
          local_1f8._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_1f8," should be used instead.\" ) = ");
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar4->_M_dataplus)._M_p;
          paVar5 = &pbVar4->field_2;
          if (paVar6 == paVar5) {
            local_238.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          }
          else {
            local_238.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            local_238._M_dataplus._M_p = (pointer)paVar6;
          }
          local_238._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_238,(__y->first)._M_dataplus._M_p,(__y->first)._M_string_length)
          ;
          local_280._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar6 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p == paVar6) {
            local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_280.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_280._M_dataplus._M_p = (pointer)paVar7;
          }
          else {
            local_280.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_280._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_280,",\n");
          local_1b8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
          paVar6 = &pbVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.first._M_dataplus._M_p == paVar6) {
            local_1b8.first.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_1b8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
            local_1b8.first._M_dataplus._M_p = (pointer)paVar11;
          }
          else {
            local_1b8.first.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          local_1b8.first._M_string_length = pbVar4->_M_string_length;
          (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar4->_M_string_length = 0;
          (pbVar4->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_1d8,local_1b8.first._M_dataplus._M_p,local_1b8.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.first._M_dataplus._M_p != paVar11) {
            operator_delete(local_1b8.first._M_dataplus._M_p,
                            local_1b8.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar7) {
            operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
          __y = __y + 1;
        } while (__y != local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      pEVar8 = local_c0 + 1;
    } while (pEVar8 != local_c8);
  }
  sVar10 = local_1d8._M_string_length;
  if (local_1d8._M_string_length != 0) {
    do {
      __pos = sVar10 - 1;
      if (sVar10 == 0) {
        __assert_fail("pos != std::string::npos",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                      ,0xce,
                      "std::string VideoHppGenerator::generateEnum(const std::pair<std::string, EnumData> &) const"
                     );
      }
      lVar9 = sVar10 - 1;
      sVar10 = __pos;
    } while (local_1d8._M_dataplus._M_p[lVar9] != ',');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_1d8,__pos,1);
    std::operator+(&local_260,"\n",&local_1d8);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_260,"  ");
    local_1b8.first._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar7 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.first._M_dataplus._M_p == paVar7) {
      local_1b8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_1b8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_1b8.first._M_dataplus._M_p = (pointer)paVar11;
    }
    else {
      local_1b8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_1b8.first._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_1d8,&local_1b8.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.first._M_dataplus._M_p != paVar11) {
      operator_delete(local_1b8.first._M_dataplus._M_p,
                      local_1b8.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"  enum class ${enumName}\n  {${enumValues}};\n","");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"StdVideo","");
  pcVar2 = (local_d0->first)._M_dataplus._M_p;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,pcVar2,pcVar2 + (local_d0->first)._M_string_length);
  sVar10 = local_280._M_string_length;
  if ((local_280._M_string_length <= local_2a0._M_string_length) &&
     ((local_280._M_string_length == 0 ||
      (iVar3 = bcmp(local_2a0._M_dataplus._M_p,local_280._M_dataplus._M_p,local_280._M_string_length
                   ), iVar3 == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&local_2a0,0,sVar10);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1b8,(char (*) [9])"enumName",&local_2a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_178,(char (*) [11])"enumValues",&local_1d8);
  __l._M_len = 2;
  __l._M_array = &local_1b8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_238,(allocator_type *)&local_1f8);
  replaceWithMap(local_d8,&local_260,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar9 = -0x80;
  paVar11 = &local_178.second.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar11->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                      paVar11->_M_allocated_capacity + 1);
    }
    if (&paVar11->_M_allocated_capacity + -4 != (size_type *)(&paVar11->_M_allocated_capacity)[-6])
    {
      operator_delete((size_type *)(&paVar11->_M_allocated_capacity)[-6],
                      (&paVar11->_M_allocated_capacity)[-4] + 1);
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar11->_M_allocated_capacity + -8);
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,
                    CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                             local_1d8.field_2._M_local_buf[0]) + 1);
  }
  return local_d8;
}

Assistant:

std::string VideoHppGenerator::generateEnum( std::pair<std::string, EnumData> const & enumData ) const
{
  std::string enumValues;
#if !defined( NDEBUG )
  std::map<std::string, std::string> valueToNameMap;
#endif

  // convert the enum name to upper case
  std::string prefix = toUpperCase( enumData.first ) + "_";
  for ( auto const & value : enumData.second.values )
  {
    std::string valueName = "e" + toCamelCase( stripPrefix( value.name, prefix ), true );
    assert( valueToNameMap.insert( { valueName, value.name } ).second );
    enumValues += "    " + valueName + " = " + value.name + ",\n";

    for ( auto const & alias : value.aliases )
    {
      std::string aliasName = "e" + toCamelCase( stripPrefix( alias.first, prefix ), true );
      assert( valueToNameMap.insert( { aliasName, alias.first } ).second );
      enumValues += "    " + aliasName + " VULKAN_HPP_DEPRECATED_17( \"" + aliasName + " is deprecated, " + valueName +
                    " should be used instead.\" ) = " + alias.first + ",\n";
    }
  }

  if ( !enumValues.empty() )
  {
    size_t pos = enumValues.rfind( ',' );
    assert( pos != std::string::npos );
    enumValues.erase( pos, 1 );
    enumValues = "\n" + enumValues + "  ";
  }

  const std::string enumTemplate = R"(  enum class ${enumName}
  {${enumValues}};
)";

  return replaceWithMap( enumTemplate, { { "enumName", stripPrefix( enumData.first, "StdVideo" ) }, { "enumValues", enumValues } } );
}